

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

void Kernel::InferenceStore::Smt2ProofCheckPrinter::outputQuoted(ostream *out,string *name)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ostream *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffe8);
  if (((((bVar1) || (bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffe8), bVar1)) ||
       (bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffe8), bVar1)) ||
      ((bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffe8), bVar1 ||
       (bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffe8), bVar1)))) ||
     ((bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffe8), bVar1 ||
      (bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffe8), bVar1)))) {
    poVar3 = std::operator<<(in_RDI,"_");
    std::operator<<(poVar3,(string *)in_RSI);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if ((*pcVar2 == '\'') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI), *pcVar2 == '$')) {
      poVar3 = std::operator<<(in_RDI,'|');
      poVar3 = std::operator<<(poVar3,(string *)in_RSI);
      std::operator<<(poVar3,"|");
    }
    else {
      std::operator<<(in_RDI,(string *)in_RSI);
    }
  }
  return;
}

Assistant:

static void outputQuoted(std::ostream& out, std::string const& name) 
  {
    if (   name == "exp"
        || name == "log"
        || name == "cos"
        || name == "sin"
        || name == "tan"
        || name == "sqrt"
        || name == "const"
        ) {
        out << "_" << name;
    } else if ( name[0] == '\'' || name[0] == '$') {
      // add one more level of quoting
      out << '|' << name << "|";
    } else  {
      out << name;
    }
  }